

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O3

pair<google::protobuf::stringpiece_internal::StringPiece,_google::protobuf::stringpiece_internal::StringPiece>
* __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare::GetParts
          (pair<google::protobuf::stringpiece_internal::StringPiece,_google::protobuf::stringpiece_internal::StringPiece>
           *__return_storage_ptr__,SymbolCompare *this,SymbolEntry *entry)

{
  pointer pEVar1;
  char *pcVar2;
  size_t size;
  pointer pcVar3;
  long lVar4;
  size_t size_00;
  
  pEVar1 = (this->index->all_values_).
           super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pcVar2 = pEVar1[entry->data_offset].encoded_package._M_dataplus._M_p;
  size = pEVar1[entry->data_offset].encoded_package._M_string_length;
  if ((long)size < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig(size,"string length exceeds max size");
  }
  else if (size == 0) {
    pcVar3 = (entry->encoded_symbol)._M_dataplus._M_p;
    size_00 = (entry->encoded_symbol)._M_string_length;
    if ((long)size_00 < 0) {
      stringpiece_internal::StringPiece::LogFatalSizeTooBig
                (size_00,"string length exceeds max size");
    }
    (__return_storage_ptr__->second).ptr_ = (char *)0x0;
    (__return_storage_ptr__->second).length_ = 0;
    (__return_storage_ptr__->first).ptr_ = pcVar3;
    lVar4 = 8;
    goto LAB_00388678;
  }
  pcVar3 = (entry->encoded_symbol)._M_dataplus._M_p;
  size_00 = (entry->encoded_symbol)._M_string_length;
  if ((long)size_00 < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig(size_00,"string length exceeds max size");
  }
  (__return_storage_ptr__->first).ptr_ = pcVar2;
  (__return_storage_ptr__->first).length_ = size;
  (__return_storage_ptr__->second).ptr_ = pcVar3;
  lVar4 = 0x18;
LAB_00388678:
  *(size_t *)((long)&(__return_storage_ptr__->first).ptr_ + lVar4) = size_00;
  return __return_storage_ptr__;
}

Assistant:

std::pair<StringPiece, StringPiece> GetParts(
        const SymbolEntry& entry) const {
      auto package = entry.package(index);
      if (package.empty()) return {entry.symbol(index), StringPiece{}};
      return {package, entry.symbol(index)};
    }